

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O3

DWARFUnit * __thiscall
llvm::DWARFDebugLine::SectionParser::prepareToParse(SectionParser *this,uint64_t Offset)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  DWARFUnit *pDVar3;
  _Base_ptr p_Var4;
  DWARFDataExtractor *pDVar5;
  uint8_t uVar6;
  
  p_Var4 = (this->LineToUnit)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 == (_Base_ptr)0x0) {
LAB_00af26d4:
    pDVar5 = this->DebugLineData;
  }
  else {
    p_Var1 = &(this->LineToUnit)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var1->_M_header;
    do {
      if (*(ulong *)(p_Var4 + 1) >= Offset) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < Offset];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 == p_Var1) || (Offset < *(ulong *)(p_Var2 + 1)))
    goto LAB_00af26d4;
    pDVar3 = (DWARFUnit *)p_Var2[1]._M_parent;
    pDVar5 = this->DebugLineData;
    if (pDVar3 != (DWARFUnit *)0x0) {
      uVar6 = (pDVar3->Header).FormParams.AddrSize;
      goto LAB_00af26dc;
    }
  }
  pDVar3 = (DWARFUnit *)0x0;
  uVar6 = '\0';
LAB_00af26dc:
  (pDVar5->super_DataExtractor).AddressSize = uVar6;
  return pDVar3;
}

Assistant:

DWARFUnit *DWARFDebugLine::SectionParser::prepareToParse(uint64_t Offset) {
  DWARFUnit *U = nullptr;
  auto It = LineToUnit.find(Offset);
  if (It != LineToUnit.end())
    U = It->second;
  DebugLineData.setAddressSize(U ? U->getAddressByteSize() : 0);
  return U;
}